

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::OneofDescriptor::DebugString
          (OneofDescriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options
          )

{
  int iVar1;
  int iVar2;
  OneofOptions *from;
  Descriptor *this_00;
  FileDescriptor *this_01;
  DescriptorPool *pool;
  FieldDescriptor *this_02;
  string_view value;
  Arg local_210;
  string_view local_1e0;
  int local_1cc;
  undefined1 local_1c8 [4];
  int i;
  OneofOptions full_options;
  Arg local_168;
  Arg local_138;
  string_view local_108;
  undefined1 local_f8 [8];
  SourceLocationCommentPrinter comment_printer;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string prefix;
  DebugStringOptions *debug_string_options_local;
  string *contents_local;
  int depth_local;
  OneofDescriptor *this_local;
  
  prefix.field_2._8_8_ = debug_string_options;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,(long)(depth * 2),' ',&local_49);
  std::allocator<char>::~allocator(&local_49);
  anon_unknown_24::SourceLocationCommentPrinter::
  SourceLocationCommentPrinter<google::protobuf::OneofDescriptor>
            ((SourceLocationCommentPrinter *)local_f8,this,(string *)local_48,
             (DebugStringOptions *)prefix.field_2._8_8_);
  anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)local_f8,contents);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_108,"$0oneof $1 {");
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
            (&local_138,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  value = name(this);
  full_options.field_0._impl_.features_ = (FeatureSet *)value._M_len;
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_168,value);
  absl::lts_20250127::SubstituteAndAppend(contents,local_108,&local_138,&local_168);
  from = options(this);
  OneofOptions::OneofOptions((OneofOptions *)local_1c8,from);
  anon_unknown_24::CopyFeaturesToOptions<google::protobuf::OneofOptions>
            (this->proto_features_,(OneofOptions *)local_1c8);
  this_00 = containing_type(this);
  this_01 = Descriptor::file(this_00);
  pool = FileDescriptor::pool(this_01);
  anon_unknown_24::FormatLineOptions(depth + 1,(Message *)local_1c8,pool,contents);
  if ((*(byte *)(prefix.field_2._8_8_ + 2) & 1) == 0) {
    std::__cxx11::string::append((char *)contents);
    local_1cc = 0;
    while( true ) {
      iVar1 = local_1cc;
      iVar2 = field_count(this);
      if (iVar2 <= iVar1) break;
      this_02 = field(this,local_1cc);
      FieldDescriptor::DebugString
                (this_02,depth + 1,contents,(DebugStringOptions *)prefix.field_2._8_8_);
      local_1cc = local_1cc + 1;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1e0,"$0}\n");
    absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
              (&local_210,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    absl::lts_20250127::SubstituteAndAppend(contents,local_1e0,&local_210);
  }
  else {
    std::__cxx11::string::append((char *)contents);
  }
  anon_unknown_24::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)local_f8,contents);
  OneofOptions::~OneofOptions((OneofOptions *)local_1c8);
  anon_unknown_24::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
            ((SourceLocationCommentPrinter *)local_f8);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void OneofDescriptor::DebugString(
    int depth, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');
  ++depth;
  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);
  absl::SubstituteAndAppend(contents, "$0oneof $1 {", prefix, name());

  OneofOptions full_options = options();
  CopyFeaturesToOptions(proto_features_, &full_options);
  FormatLineOptions(depth, full_options, containing_type()->file()->pool(),
                    contents);

  if (debug_string_options.elide_oneof_body) {
    contents->append(" ... }\n");
  } else {
    contents->append("\n");
    for (int i = 0; i < field_count(); i++) {
      field(i)->DebugString(depth, contents, debug_string_options);
    }
    absl::SubstituteAndAppend(contents, "$0}\n", prefix);
  }
  comment_printer.AddPostComment(contents);
}